

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_ConstrainInit(void)

{
  byte *pbVar1;
  uint uVar2;
  void *pvVar3;
  MinRegMan_t *pMVar4;
  int iVar5;
  undefined8 *puVar6;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Abc_Ntk_t *pAVar9;
  int iVar10;
  Abc_Obj_t *pObj;
  int iVar11;
  long lVar12;
  ulong uVar13;
  
  puVar6 = (undefined8 *)calloc(1,0x28);
  pAVar9 = pManMR->pInitNtk;
  if (pAVar9 == (Abc_Ntk_t *)0x0) {
    __assert_fail("pManMR->pInitNtk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                  ,0x408,"void Abc_FlowRetime_ConstrainInit()");
  }
  if (pManMR->fVerbose != 0) {
    puts("\tsearch for initial state conflict...");
    pAVar9 = pManMR->pInitNtk;
  }
  vNodes = Abc_NtkDfs(pAVar9,0);
  pVVar7 = pManMR->pInitNtk->vPis;
  if (0 < pVVar7->nSize) {
    iVar5 = vNodes->nSize;
    uVar13 = (ulong)(uint)vNodes->nCap;
    lVar12 = 0;
    iVar10 = iVar5;
    do {
      pvVar3 = pVVar7->pArray[lVar12];
      iVar11 = (int)uVar13;
      if (iVar10 == iVar11) {
        if (iVar11 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(0x80);
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar8;
          vNodes->nCap = 0x10;
          uVar13 = 0x10;
        }
        else {
          uVar13 = (ulong)(uint)(iVar11 * 2);
          if (vNodes->pArray == (void **)0x0) {
            ppvVar8 = (void **)malloc(uVar13 * 8);
          }
          else {
            ppvVar8 = (void **)realloc(vNodes->pArray,uVar13 * 8);
          }
          vNodes->pArray = ppvVar8;
          vNodes->nCap = iVar11 * 2;
        }
      }
      else {
        ppvVar8 = vNodes->pArray;
      }
      iVar11 = vNodes->nSize;
      iVar10 = iVar11 + 1;
      vNodes->nSize = iVar10;
      ppvVar8[iVar11] = pvVar3;
      lVar12 = lVar12 + 1;
      pVVar7 = pManMR->pInitNtk->vPis;
    } while (lVar12 < pVVar7->nSize);
    if (iVar5 <= iVar11) {
      iVar11 = iVar5 + iVar10;
      ppvVar8 = vNodes->pArray;
      if (vNodes->nCap < iVar11) {
        if (ppvVar8 == (void **)0x0) {
          ppvVar8 = (void **)malloc((long)iVar11 << 3);
        }
        else {
          ppvVar8 = (void **)realloc(ppvVar8,(long)iVar11 << 3);
          iVar10 = vNodes->nSize;
        }
        vNodes->pArray = ppvVar8;
        vNodes->nCap = iVar11;
      }
      memmove(ppvVar8 + iVar10,ppvVar8,(long)iVar5 * 8);
      memmove(vNodes->pArray,vNodes->pArray + iVar5,(long)vNodes->nSize << 3);
      iVar5 = Abc_FlowRetime_PartialSat(vNodes,0);
      if (iVar5 != 0) {
        __assert_fail("!Abc_FlowRetime_PartialSat( vNodes, 0 )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                      ,0x414,"void Abc_FlowRetime_ConstrainInit()");
      }
      while( true ) {
        if (pManMR->fVerbose != 0) {
          printf("\t\t");
        }
        if (vNodes->nSize != 1) {
          iVar5 = Abc_FlowRetime_PartialSat(vNodes,vNodes->nSize >> 1);
          if (pManMR->fVerbose != 0) {
            putchar((uint)(iVar5 == 0) * 3 + 0x2a);
          }
          fflush(_stdout);
        }
        iVar5 = Abc_FlowRetime_PartialSat(vNodes,1);
        if (iVar5 == 0) {
          __assert_fail("Abc_FlowRetime_PartialSat( vNodes, high )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x42b,"void Abc_FlowRetime_ConstrainInit()");
        }
        iVar5 = Abc_FlowRetime_PartialSat(vNodes,0);
        if (iVar5 != 0) {
          __assert_fail("!Abc_FlowRetime_PartialSat( vNodes, low )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x42c,"void Abc_FlowRetime_ConstrainInit()");
        }
        if (vNodes->nSize < 1) break;
        pObj = (Abc_Obj_t *)*vNodes->pArray;
        Abc_NtkMarkCone_rec(pObj,1);
        if (pManMR->fVerbose != 0) {
          printf("   conflict term = %d ",0);
        }
        iVar5 = pObj->Id;
        if (pManMR->sizeInitToOrig <= iVar5) {
LAB_004dbfdc:
          __assert_fail("id < pManMR->sizeInitToOrig",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x531,"void Abc_FlowRetime_GetInitToOrig(Abc_Obj_t *, Abc_Obj_t **, int *)"
                       );
        }
        while( true ) {
          iVar10 = pManMR->pInitToOrig[iVar5].id;
          if (-1 < (long)iVar10) break;
          if ((pObj->vFanins).nSize == 0) {
            __assert_fail("Abc_ObjFaninNum(pInit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                          ,0x536,
                          "void Abc_FlowRetime_GetInitToOrig(Abc_Obj_t *, Abc_Obj_t **, int *)");
          }
          pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
          iVar5 = pObj->Id;
          if (pManMR->sizeInitToOrig <= iVar5) goto LAB_004dbfdc;
        }
        pVVar7 = pManMR->pNtk->vObjs;
        if (pVVar7->nSize <= iVar10) break;
        pvVar3 = pVVar7->pArray[iVar10];
        if (pvVar3 == (void *)0x0) {
          __assert_fail("pOrigObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretInit.c"
                        ,0x43e,"void Abc_FlowRetime_ConstrainInit()");
        }
        uVar2 = pManMR->pInitToOrig[iVar5].lag;
        if (pManMR->fVerbose != 0) {
          printf(" <=> %d/%d\n",(ulong)*(uint *)((long)pvVar3 + 0x10),(ulong)uVar2);
        }
        Vec_IntPush((Vec_Int_t *)(puVar6 + 1),*(int *)((long)pvVar3 + 0x10));
        Vec_IntPush((Vec_Int_t *)(puVar6 + 3),uVar2);
        iVar5 = Abc_FlowRetime_PartialSat(vNodes,vNodes->nSize);
        if (iVar5 == 0) {
          *puVar6 = 0;
          pVVar7 = pManMR->vInitConstraints;
          uVar2 = pVVar7->nSize;
          if (uVar2 == pVVar7->nCap) {
            if ((int)uVar2 < 0x10) {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,0x80);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = 0x10;
            }
            else {
              if (pVVar7->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar2 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
              }
              pVVar7->pArray = ppvVar8;
              pVVar7->nCap = uVar2 * 2;
            }
          }
          else {
            ppvVar8 = pVVar7->pArray;
          }
          iVar5 = pVVar7->nSize;
          pVVar7->nSize = iVar5 + 1;
          ppvVar8[iVar5] = puVar6;
          pMVar4 = pManMR;
          pAVar9 = pManMR->pInitNtk;
          pVVar7 = pAVar9->vObjs;
          if (0 < pVVar7->nSize) {
            lVar12 = 0;
            do {
              if (pVVar7->pArray[lVar12] != (void *)0x0) {
                pbVar1 = (byte *)((long)pVVar7->pArray[lVar12] + 0x14);
                *pbVar1 = *pbVar1 & 0xef;
                pAVar9 = pMVar4->pInitNtk;
              }
              lVar12 = lVar12 + 1;
              pVVar7 = pAVar9->vObjs;
            } while (lVar12 < pVVar7->nSize);
          }
          if (vNodes->pArray != (void **)0x0) {
            free(vNodes->pArray);
          }
          free(vNodes);
          return;
        }
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  __assert_fail("nItems < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x347,"void Vec_PtrReorder(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_FlowRetime_ConstrainInit( ) {
  Vec_Ptr_t *vNodes;
  int low, high, mid;
  int i, n, lag;
  Abc_Obj_t *pObj = NULL, *pOrigObj;
  InitConstraint_t *pConstraint = ABC_ALLOC( InitConstraint_t, 1 );

  memset( pConstraint, 0, sizeof(InitConstraint_t) );

  assert(pManMR->pInitNtk);

  vprintf("\tsearch for initial state conflict...\n");

  vNodes = Abc_NtkDfs(pManMR->pInitNtk, 0);
  n = Vec_PtrSize(vNodes);
  // also add PIs to vNodes
  Abc_NtkForEachPi(pManMR->pInitNtk, pObj, i) 
    Vec_PtrPush(vNodes, pObj);
  Vec_PtrReorder(vNodes, n);

#if defined(DEBUG_CHECK)
    assert(!Abc_FlowRetime_PartialSat( vNodes, 0 ));
#endif

  // grow initialization constraint
  do {
    vprintf("\t\t");

    // find element to add to set...
    low = 0, high = Vec_PtrSize(vNodes);
    while (low != high-1) {
      mid = (low + high) >> 1;
      
      if (!Abc_FlowRetime_PartialSat( vNodes, mid )) {
        low = mid;
        vprintf("-");
      } else {
        high = mid;
        vprintf("*");
      }
      fflush(stdout);
    }
      
#if defined(DEBUG_CHECK)
    assert(Abc_FlowRetime_PartialSat( vNodes, high ));
    assert(!Abc_FlowRetime_PartialSat( vNodes, low ));
#endif
    
    // mark its TFO
    pObj = (Abc_Obj_t*)Vec_PtrEntry( vNodes, low );
    Abc_NtkMarkCone_rec( pObj, 1 );
    vprintf("   conflict term = %d ", low);

#if 0
    printf("init ------\n");
    Abc_ObjPrint(stdout, pObj);
    printf("\n");
    Abc_ObjPrintNeighborhood( pObj, 1 );
    printf("------\n");
#endif

    // add node to constraint
    Abc_FlowRetime_GetInitToOrig( pObj, &pOrigObj, &lag );
    assert(pOrigObj);
    vprintf(" <=> %d/%d\n", Abc_ObjId(pOrigObj), lag);

#if 0    
    printf("orig ------\n");
    Abc_ObjPrint(stdout, pOrigObj);
    printf("\n");
    Abc_ObjPrintNeighborhood( pOrigObj, 1 );
    printf("------\n");
#endif
    Vec_IntPush( &pConstraint->vNodes, Abc_ObjId(pOrigObj) );
    Vec_IntPush( &pConstraint->vLags, lag );

  } while (Abc_FlowRetime_PartialSat( vNodes, Vec_PtrSize(vNodes) ));

  pConstraint->pBiasNode = NULL;

  // add constraint
  Vec_PtrPush( pManMR->vInitConstraints, pConstraint );

  // clear marks
  Abc_NtkForEachObj( pManMR->pInitNtk, pObj, i)
    pObj->fMarkA = 0;

  // free
  Vec_PtrFree( vNodes );
}